

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeColSingletonPS::execute
          (FreeColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  int iVar1;
  fpclass_type fVar2;
  pointer pnVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  int32_t iVar5;
  bool bVar6;
  int32_t iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  fpclass_type *pfVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  bool *pbVar17;
  int32_t *piVar18;
  uint *puVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  uint *puVar22;
  pointer pnVar23;
  long lVar24;
  byte bVar25;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  uint local_3d8 [3];
  undefined3 uStack_3cb;
  int iStack_3c8;
  bool abStack_3c4 [4];
  fpclass_type local_3c0 [4];
  undefined8 uStack_3b0;
  cpp_dec_float<200U,_int,_void> local_3a8;
  cpp_dec_float<200U,_int,_void> local_328;
  cpp_dec_float<200U,_int,_void> local_2a8;
  cpp_dec_float<200U,_int,_void> local_228;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [13];
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  cpp_dec_float<200U,_int,_void> local_120;
  uint local_a0 [28];
  
  bVar25 = 0;
  iVar10 = this->m_i;
  iVar1 = this->m_old_i;
  if (iVar10 != iVar1) {
    pnVar3 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar19 = (uint *)(pnVar3 + iVar10);
    puVar22 = (uint *)(pnVar3 + iVar1);
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar22 = *puVar19;
      puVar19 = puVar19 + 1;
      puVar22 = puVar22 + 1;
    }
    pnVar3[iVar1].m_backend.exp = pnVar3[iVar10].m_backend.exp;
    pnVar3[iVar1].m_backend.neg = pnVar3[iVar10].m_backend.neg;
    iVar7 = pnVar3[iVar10].m_backend.prec_elem;
    pnVar3[iVar1].m_backend.fpclass = pnVar3[iVar10].m_backend.fpclass;
    pnVar3[iVar1].m_backend.prec_elem = iVar7;
    iVar10 = this->m_i;
    pnVar3 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar1 = this->m_old_i;
    puVar19 = (uint *)(pnVar3 + iVar10);
    puVar22 = (uint *)(pnVar3 + iVar1);
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar22 = *puVar19;
      puVar19 = puVar19 + 1;
      puVar22 = puVar22 + 1;
    }
    pnVar3[iVar1].m_backend.exp = pnVar3[iVar10].m_backend.exp;
    pnVar3[iVar1].m_backend.neg = pnVar3[iVar10].m_backend.neg;
    iVar7 = pnVar3[iVar10].m_backend.prec_elem;
    pnVar3[iVar1].m_backend.fpclass = pnVar3[iVar10].m_backend.fpclass;
    pnVar3[iVar1].m_backend.prec_elem = iVar7;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  iVar10 = this->m_j;
  iVar1 = this->m_old_j;
  if (iVar10 != iVar1) {
    pnVar3 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar19 = (uint *)(pnVar3 + iVar10);
    puVar22 = (uint *)(pnVar3 + iVar1);
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar22 = *puVar19;
      puVar19 = puVar19 + 1;
      puVar22 = puVar22 + 1;
    }
    pnVar3[iVar1].m_backend.exp = pnVar3[iVar10].m_backend.exp;
    pnVar3[iVar1].m_backend.neg = pnVar3[iVar10].m_backend.neg;
    iVar7 = pnVar3[iVar10].m_backend.prec_elem;
    pnVar3[iVar1].m_backend.fpclass = pnVar3[iVar10].m_backend.fpclass;
    pnVar3[iVar1].m_backend.prec_elem = iVar7;
    iVar10 = this->m_j;
    pnVar3 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar1 = this->m_old_j;
    puVar19 = (uint *)(pnVar3 + iVar10);
    puVar22 = (uint *)(pnVar3 + iVar1);
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar22 = *puVar19;
      puVar19 = puVar19 + 1;
      puVar22 = puVar22 + 1;
    }
    pnVar3[iVar1].m_backend.exp = pnVar3[iVar10].m_backend.exp;
    pnVar3[iVar1].m_backend.neg = pnVar3[iVar10].m_backend.neg;
    iVar7 = pnVar3[iVar10].m_backend.prec_elem;
    pnVar3[iVar1].m_backend.fpclass = pnVar3[iVar10].m_backend.fpclass;
    pnVar3[iVar1].m_backend.prec_elem = iVar7;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  local_328.fpclass = cpp_dec_float_finite;
  local_328.prec_elem = 0x1c;
  local_328.data._M_elems[0] = 0;
  local_328.data._M_elems[1] = 0;
  local_328.data._M_elems[2] = 0;
  local_328.data._M_elems[3] = 0;
  local_328.data._M_elems[4] = 0;
  local_328.data._M_elems[5] = 0;
  local_328.data._M_elems[6] = 0;
  local_328.data._M_elems[7] = 0;
  local_328.data._M_elems[8] = 0;
  local_328.data._M_elems[9] = 0;
  local_328.data._M_elems[10] = 0;
  local_328.data._M_elems[0xb] = 0;
  local_328.data._M_elems[0xc] = 0;
  local_328.data._M_elems[0xd] = 0;
  local_328.data._M_elems[0xe] = 0;
  local_328.data._M_elems[0xf] = 0;
  local_328.data._M_elems[0x10] = 0;
  local_328.data._M_elems[0x11] = 0;
  local_328.data._M_elems[0x12] = 0;
  local_328.data._M_elems[0x13] = 0;
  local_328.data._M_elems[0x14] = 0;
  local_328.data._M_elems[0x15] = 0;
  local_328.data._M_elems[0x16] = 0;
  local_328.data._M_elems[0x17] = 0;
  local_328.data._M_elems[0x18] = 0;
  local_328.data._M_elems[0x19] = 0;
  local_328.data._M_elems._104_5_ = 0;
  local_328.data._M_elems[0x1b]._1_3_ = 0;
  local_328.exp = 0;
  local_328.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_328,0.0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_120,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  if (0 < (this->m_row).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar12 = 0;
    lVar24 = 0;
    do {
      pNVar4 = (this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if (*(int *)((long)(&pNVar4->val + 1) + lVar12) != this->m_j) {
        pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)(pNVar4->val).m_backend.data._M_elems + lVar12);
        pcVar21 = &(x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(int *)((long)(&pNVar4->val + 1) + lVar12)].m_backend;
        local_3c0[0] = cpp_dec_float_finite;
        local_3c0[1] = 0x1c;
        local_438 = ZEXT816(0);
        local_428 = ZEXT816(0);
        local_418 = ZEXT816(0);
        local_408 = ZEXT816(0);
        local_3f8 = ZEXT816(0);
        local_3e8 = ZEXT816(0);
        local_3d8[0] = 0;
        local_3d8[1] = 0;
        stack0xfffffffffffffc30 = 0;
        uStack_3cb = 0;
        iStack_3c8 = 0;
        abStack_3c4[0] = false;
        pcVar11 = pcVar20;
        if (((cpp_dec_float<200U,_int,_void> *)local_438 != pcVar21) &&
           (pcVar11 = pcVar21, pcVar20 != (cpp_dec_float<200U,_int,_void> *)local_438)) {
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)local_438;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar21->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar25 * -8 + 4);
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar25 * -8 + 4);
          }
          iStack_3c8 = *(int *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar12);
          abStack_3c4[0] = *(bool *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar12 + 4);
          local_3c0._0_8_ = *(undefined8 *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar12 + 8);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_438,pcVar11);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&local_328,(cpp_dec_float<200U,_int,_void> *)local_438);
      }
      lVar24 = lVar24 + 1;
      lVar12 = lVar12 + 0x84;
    } while (lVar24 < (this->m_row).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  u = &this->m_lRhs;
  pnVar16 = u;
  pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_438;
  for (lVar12 = 0x1c; uVar8 = local_328._120_8_, bVar6 = local_328.neg, iVar10 = local_328.exp,
      lVar12 != 0; lVar12 = lVar12 + -1) {
    (pcVar20->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + (ulong)bVar25 * -8 + 4);
    pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar25 * -2 + 1) * 4);
  }
  abStack_3c4[0] = (this->m_lRhs).m_backend.neg;
  iStack_3c8 = (this->m_lRhs).m_backend.exp;
  fVar2 = (this->m_lRhs).m_backend.fpclass;
  iVar5 = (this->m_lRhs).m_backend.prec_elem;
  local_3c0[0] = fVar2;
  local_3c0[1] = iVar5;
  if ((abStack_3c4[0] == true) && (local_438._0_4_ != 0 || fVar2 != cpp_dec_float_finite)) {
    abStack_3c4[0] = false;
  }
  pcVar20 = &local_328;
  pcVar11 = &local_3a8;
  for (lVar12 = 0x1c; uVar9 = local_328._120_8_, lVar12 != 0; lVar12 = lVar12 + -1) {
    (pcVar11->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
    pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar25 * -8 + 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar25 * -2 + 1) * 4);
  }
  local_3a8.exp = iVar10;
  local_3a8.neg = bVar6;
  local_328.fpclass = (fpclass_type)uVar8;
  local_328.prec_elem = SUB84(uVar8,4);
  local_3a8.fpclass = local_328.fpclass;
  local_3a8.prec_elem = local_328.prec_elem;
  if ((bVar6 != false) &&
     (local_3a8.data._M_elems[0] != 0 || (fpclass_type)uVar8 != cpp_dec_float_finite)) {
    local_3a8.neg = (bool)(bVar6 ^ 1);
  }
  local_328._120_8_ = uVar9;
  if ((fpclass_type)uVar8 == cpp_dec_float_NaN || fVar2 == cpp_dec_float_NaN) {
    bVar6 = false;
  }
  else {
    iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)local_438,&local_3a8);
    bVar6 = 0 < iVar10;
  }
  pcVar20 = &local_3a8;
  if (bVar6) {
    pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_438;
  }
  pcVar11 = &local_2a8;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pcVar11->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
    pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar25 * -2 + 1) * 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar25 * -2 + 1) * 4);
  }
  piVar14 = &local_3a8.exp;
  if (bVar6) {
    piVar14 = &iStack_3c8;
  }
  pbVar17 = &local_3a8.neg;
  if (bVar6) {
    pbVar17 = abStack_3c4;
  }
  local_2a8.exp = *piVar14;
  local_2a8.neg = *pbVar17;
  pfVar15 = &local_3a8.fpclass;
  if (bVar6) {
    pfVar15 = local_3c0;
  }
  piVar18 = &local_3a8.prec_elem;
  if (bVar6) {
    piVar18 = (int32_t *)(local_3c0 + 1);
  }
  local_2a8.fpclass = *pfVar15;
  local_2a8.prec_elem = *piVar18;
  if (*pfVar15 != cpp_dec_float_NaN) {
    local_3c0[0] = cpp_dec_float_finite;
    local_3c0[1] = 0x1c;
    local_438 = (undefined1  [16])0x0;
    local_428 = (undefined1  [16])0x0;
    local_418 = (undefined1  [16])0x0;
    local_408 = (undefined1  [16])0x0;
    local_3f8 = (undefined1  [16])0x0;
    local_3e8 = (undefined1  [16])0x0;
    local_3d8[0] = 0;
    local_3d8[1] = 0;
    stack0xfffffffffffffc30 = 0;
    uStack_3cb = 0;
    iStack_3c8 = 0;
    abStack_3c4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_438,1.0);
    iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_2a8,(cpp_dec_float<200U,_int,_void> *)local_438);
    if (iVar10 < 0) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_2a8,1.0);
    }
  }
  local_3c0[0] = cpp_dec_float_finite;
  local_3c0[1] = 0x1c;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3d8[0] = 0;
  local_3d8[1] = 0;
  stack0xfffffffffffffc30 = 0;
  uStack_3cb = 0;
  iStack_3c8 = 0;
  abStack_3c4[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_438,&u->m_backend,&local_2a8);
  local_130._0_4_ = cpp_dec_float_finite;
  local_130._4_4_ = 0x1c;
  local_1a8 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  local_148 = SUB1613((undefined1  [16])0x0,0);
  uStack_13b = 0;
  iStack_138 = 0;
  bStack_134 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_1a8,&local_328,&local_2a8);
  local_3a8.fpclass = cpp_dec_float_finite;
  local_3a8.prec_elem = 0x1c;
  local_3a8.exp = 0;
  local_3a8.neg = false;
  pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_438;
  pcVar11 = &local_3a8;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pcVar11->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
    pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar25 * -8 + 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar25 * -8 + 4);
  }
  local_3a8.exp = iStack_3c8;
  local_3a8.neg = abStack_3c4[0];
  local_3a8.fpclass = local_3c0[0];
  local_3a8.prec_elem = local_3c0[1];
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&local_3a8,(cpp_dec_float<200U,_int,_void> *)local_1a8);
  uVar8 = local_3a8._120_8_;
  bVar6 = local_3a8.neg;
  iVar10 = local_3a8.exp;
  pcVar20 = &local_3a8;
  puVar19 = local_a0;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar19 = (pcVar20->data)._M_elems[0];
    pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar25 * -8 + 4);
    puVar19 = puVar19 + (ulong)bVar25 * -2 + 1;
  }
  local_3c0[2] = local_3a8.fpclass;
  local_3c0[3] = local_3a8.prec_elem;
  uStack_3b0 = 0;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_228,this);
  puVar19 = local_a0;
  puVar22 = (uint *)local_438;
  for (lVar12 = 0x1c; uVar9 = local_3a8._120_8_, lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar22 = *puVar19;
    puVar19 = puVar19 + (ulong)bVar25 * -2 + 1;
    puVar22 = puVar22 + (ulong)bVar25 * -2 + 1;
  }
  iStack_3c8 = iVar10;
  abStack_3c4[0] = bVar6;
  local_3a8.fpclass = (fpclass_type)uVar8;
  local_3a8.prec_elem = SUB84(uVar8,4);
  local_3c0[0] = local_3a8.fpclass;
  local_3c0[1] = local_3a8.prec_elem;
  if ((bVar6 == true) && (local_438._0_4_ != 0 || local_3c0[2] != cpp_dec_float_finite)) {
    abStack_3c4[0] = false;
  }
  local_3a8._120_8_ = uVar9;
  if (((local_3c0[2] != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN)) &&
     (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_438,&local_228), iVar10 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_3a8,0.0);
  }
  local_130._0_4_ = cpp_dec_float_finite;
  local_130._4_4_ = 0x1c;
  iStack_138 = 0;
  bStack_134 = false;
  pcVar20 = &local_3a8;
  pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_1a8;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pcVar11->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
    pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar25 * -2 + 1) * 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar25 * -8 + 4);
  }
  iStack_138 = local_3a8.exp;
  bStack_134 = local_3a8.neg;
  local_130._0_4_ = local_3a8.fpclass;
  local_130._4_4_ = local_3a8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_1a8,&local_2a8);
  local_3c0[0] = cpp_dec_float_finite;
  local_3c0[1] = 0x1c;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3d8[0] = 0;
  local_3d8[1] = 0;
  stack0xfffffffffffffc30 = 0;
  uStack_3cb = 0;
  iStack_3c8 = 0;
  abStack_3c4[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_438,(cpp_dec_float<200U,_int,_void> *)local_1a8
             ,&local_120);
  iVar10 = this->m_j;
  pnVar3 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_438;
  pnVar23 = pnVar3 + iVar10;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pnVar23->m_backend).data._M_elems[0] = (pcVar20->data)._M_elems[0];
    pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar25 * -8 + 4);
    pnVar23 = (pointer)((long)pnVar23 + ((ulong)bVar25 * -2 + 1) * 4);
  }
  pnVar3[iVar10].m_backend.exp = iStack_3c8;
  pnVar3[iVar10].m_backend.neg = abStack_3c4[0];
  pnVar3[iVar10].m_backend.fpclass = local_3c0[0];
  pnVar3[iVar10].m_backend.prec_elem = local_3c0[1];
  iVar10 = this->m_i;
  pnVar3 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar23 = pnVar3 + iVar10;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pnVar23->m_backend).data._M_elems[0] = (u->m_backend).data._M_elems[0];
    u = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)((long)u + (ulong)bVar25 * -8 + 4);
    pnVar23 = (pointer)((long)pnVar23 + ((ulong)bVar25 * -2 + 1) * 4);
  }
  pnVar3[iVar10].m_backend.exp = (this->m_lRhs).m_backend.exp;
  pnVar3[iVar10].m_backend.neg = (this->m_lRhs).m_backend.neg;
  iVar7 = (this->m_lRhs).m_backend.prec_elem;
  pnVar3[iVar10].m_backend.fpclass = (this->m_lRhs).m_backend.fpclass;
  pnVar3[iVar10].m_backend.prec_elem = iVar7;
  local_3c0[0] = cpp_dec_float_finite;
  local_3c0[1] = 0x1c;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3d8[0] = 0;
  local_3d8[1] = 0;
  stack0xfffffffffffffc30 = 0;
  uStack_3cb = 0;
  iStack_3c8 = 0;
  abStack_3c4[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_438,&(this->m_obj).m_backend,&local_120);
  iVar10 = this->m_i;
  pnVar3 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_438;
  pnVar23 = pnVar3 + iVar10;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pnVar23->m_backend).data._M_elems[0] = (pcVar20->data)._M_elems[0];
    pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar25 * -8 + 4);
    pnVar23 = (pointer)((long)pnVar23 + ((ulong)bVar25 * -2 + 1) * 4);
  }
  pnVar3[iVar10].m_backend.exp = iStack_3c8;
  pnVar3[iVar10].m_backend.neg = abStack_3c4[0];
  pnVar3[iVar10].m_backend.fpclass = local_3c0[0];
  pnVar3[iVar10].m_backend.prec_elem = local_3c0[1];
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)
             ((r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  cStatus->data[this->m_j] = BASIC;
  if (this->m_eqCons == true) {
    rStatus->data[this->m_i] = FIXED;
  }
  else if (this->m_onLhs == true) {
    rStatus->data[this->m_i] = ON_LOWER;
  }
  else {
    rStatus->data[this->m_i] = ON_UPPER;
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_lRhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_lRhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_lRhs;

   // dual:
   y[m_i] = m_obj / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}